

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_reserve_success_enoughCapacityBufferNotNull_fn(int _i)

{
  bool bVar1;
  char *pcVar2;
  char *expr;
  char **ppcVar3;
  int line;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  undefined8 *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = 8;
  local_38 = 0;
  local_28 = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x10ada1;
  local_20 = (undefined8 *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  *local_20 = 0x3035353535353535;
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  uStack_50 = 0x10add4;
  bVar1 = private_ACUtils_ADynArray_reserve(&local_48,8,false,1);
  if (bVar1 == true) {
    uStack_50 = 0x10adee;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xca);
    if (local_30 == 8) {
      uStack_50 = 0x10ae0e;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0xcb);
      if (local_28 == 8) {
        uStack_50 = 0x10ae2e;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0xcc);
        if (local_20 == (undefined8 *)0x0) {
          local_58 = 0;
          uStack_50 = 0;
          pcStack_60 = (char *)0x10afe9;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0xcd,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x","(void*) array.buffer != NULL",
                            "(void*) array.buffer");
        }
        uStack_50 = 0x10ae4e;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0xcd);
        lVar7 = 0;
        do {
          uVar6 = (ulong)*(char *)((long)local_20 + lVar7);
          if (uVar6 != 0x35) {
            pcStack_60 = "\'5\'";
            pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
            pcVar4 = "array.buffer[i] == \'5\'";
            pcVar5 = "array.buffer[i]";
            line = 0xcf;
            local_58 = 0x35;
            goto LAB_0010af01;
          }
          uStack_50 = 0x10ae6e;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0xcf);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 7);
        uVar6 = (ulong)*(char *)((long)local_20 + 7);
        if (uVar6 == 0x30) {
          uStack_50 = 0x10ae9c;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0xd0);
          if (local_38 == 0) {
            uStack_50 = 0x10aebb;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0xd1);
            uStack_50 = 0x10aec4;
            (*pcStack_40)(local_20);
            return;
          }
          expr = "Assertion \'_ck_x == NULL\' failed";
          pcVar2 = "Assertion \'%s\' failed: %s == %#x";
          pcVar4 = "(void*) array.growStrategy == NULL";
          pcVar5 = "(void*) array.growStrategy";
          line = 0xd1;
          ppcVar3 = (char **)&uStack_50;
          uVar6 = local_38;
          goto LAB_0010af03;
        }
        pcStack_60 = "\'0\'";
        pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
        pcVar4 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'";
        pcVar5 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]";
        line = 0xd0;
        local_58 = 0x30;
        goto LAB_0010af01;
      }
      pcVar4 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar5 = "array.capacity";
      line = 0xcc;
      uVar6 = local_28;
    }
    else {
      pcVar4 = "array.size == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar5 = "array.size";
      line = 0xcb;
      uVar6 = local_30;
    }
    pcStack_60 = "private_ACUtilsTest_ADynArray_capacityMin";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    local_58 = 8;
  }
  else {
    uVar6 = (ulong)bVar1;
    pcStack_60 = "true";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = 
    "private_ACUtils_ADynArray_reserve(&array, array.capacity, false, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar5 = 
    "private_ACUtils_ADynArray_reserve(&array, array.capacity, false, sizeof(*(&array)->buffer))";
    line = 0xca;
    local_58 = 1;
  }
LAB_0010af01:
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  ppcVar3 = &pcStack_60;
LAB_0010af03:
  uStack_50 = 0;
  *(ulong *)((long)ppcVar3 + -8) = uVar6;
  *(undefined8 *)((long)ppcVar3 + -0x10) = 0x10af0a;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,expr,pcVar2,pcVar4,pcVar5);
}

Assistant:

START_TEST(test_ADynArray_reserve_success_enoughCapacityBufferNotNull)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = nullptr;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, array.capacity), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NULL(array.growStrategy);
    array.deallocator(array.buffer);
}